

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

bool __thiscall cmComputeLinkDepends::CheckCircularDependencies(cmComputeLinkDepends *this)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  pointer pcVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_01;
  NodeList *pNVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  size_type sVar5;
  const_reference pvVar6;
  ostream *poVar7;
  string *psVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_03;
  reference puVar9;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_04;
  const_reference pvVar10;
  undefined1 local_2c8 [16];
  string local_2b8;
  string local_298;
  LinkEntry *local_278;
  LinkEntry *dependee;
  size_t j;
  cmGraphEdge *ni_1;
  const_iterator __end3;
  const_iterator __begin3;
  EdgeList *__range3;
  EdgeList *el;
  LinkEntry *local_220;
  LinkEntry *depender;
  size_t i;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  NodeList *__range2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap;
  undefined1 local_1e0 [8];
  ostringstream e;
  undefined1 local_61;
  _Base_ptr p_Stack_60;
  anon_class_1_0_00000001 formatItem;
  size_t ni;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  bool cycleDetected;
  NodeList *nl;
  size_t c;
  size_t nc;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeLinkDepends *this_local;
  
  pcVar3 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
           operator->(&this->CCG);
  this_01 = cmComputeComponentGraph::GetComponents(pcVar3);
  pNVar4 = (NodeList *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_01)
  ;
  nl = (NodeList *)0x0;
  do {
    if (pNVar4 <= nl) {
      return true;
    }
    this_02 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_01,(size_type)nl)->
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_02);
    if (1 < sVar5) {
      bVar2 = false;
      __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_02);
      ni = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&ni), bVar1) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
        p_Stack_60 = (_Base_ptr)*puVar9;
        pvVar6 = std::
                 vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ::operator[](&this->EntryList,(size_type)p_Stack_60);
        if (pvVar6->Kind == Group) {
          bVar2 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        poVar7 = std::operator<<((ostream *)local_1e0,
                                 "The inter-target dependency graph, for the target \"");
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        poVar7 = std::operator<<(poVar7,(string *)psVar8);
        std::operator<<(poVar7,"\", contains the following strongly connected component (cycle):\n")
        ;
        pcVar3 = std::
                 unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                 ::operator->(&this->CCG);
        this_03 = cmComputeComponentGraph::GetComponentMap(pcVar3);
        __end2_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_02);
        i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_02);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&i), bVar2) {
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&__end2_1);
          depender = (LinkEntry *)*puVar9;
          local_220 = std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(size_type)depender);
          poVar7 = std::operator<<((ostream *)local_1e0,"  ");
          const::$_0::operator()::LinkEntry_const___const((string *)&el,&local_61,local_220);
          poVar7 = std::operator<<(poVar7,(string *)&el);
          std::operator<<(poVar7,"\n");
          std::__cxx11::string::~string((string *)&el);
          this_04 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                               (&(this->EntryConstraintGraph).
                                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                (size_type)depender)->
                     super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          __end3 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_04);
          ni_1 = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_04)
          ;
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                             *)&ni_1), bVar2) {
            j = (size_t)__gnu_cxx::
                        __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                        ::operator*(&__end3);
            dependee = (LinkEntry *)cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)j);
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (this_03,(size_type)dependee);
            if ((NodeList *)*pvVar10 == nl) {
              local_278 = std::
                          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ::operator[](&this->EntryList,(size_type)dependee);
              poVar7 = std::operator<<((ostream *)local_1e0,"    depends on ");
              const::$_0::operator()::LinkEntry_const___const(&local_298,&local_61,local_278);
              poVar7 = std::operator<<(poVar7,(string *)&local_298);
              std::operator<<(poVar7,"\n");
              std::__cxx11::string::~string((string *)&local_298);
            }
            __gnu_cxx::
            __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
            ::operator++(&__end3);
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end2_1);
        }
        this_00 = this->CMakeInstance;
        std::__cxx11::ostringstream::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2c8);
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_2c8 + 0x10),
                            (cmListFileBacktrace *)local_2c8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2c8);
        std::__cxx11::string::~string((string *)(local_2c8 + 0x10));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        return false;
      }
    }
    nl = (NodeList *)
         ((long)&(nl->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

bool cmComputeLinkDepends::CheckCircularDependencies() const
{
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // no group must be evolved
    bool cycleDetected = false;
    for (size_t ni : nl) {
      if (this->EntryList[ni].Kind == LinkEntry::Group) {
        cycleDetected = true;
        break;
      }
    }
    if (!cycleDetected) {
      continue;
    }

    // Construct the error message.
    auto formatItem = [](LinkEntry const& entry) -> std::string {
      if (entry.Kind == LinkEntry::Group) {
        auto items =
          entry.Item.Value.substr(entry.Item.Value.find(':', 12) + 1);
        items.pop_back();
        std::replace(items.begin(), items.end(), '|', ',');
        return cmStrCat("group \"", ExtractGroupFeature(entry.Item.Value),
                        ":{", items, "}\"");
      }
      return cmStrCat('"', entry.Item.Value, '"');
    };

    std::ostringstream e;
    e << "The inter-target dependency graph, for the target \""
      << this->Target->GetName()
      << "\", contains the following strongly connected component "
         "(cycle):\n";
    std::vector<size_t> const& cmap = this->CCG->GetComponentMap();
    for (size_t i : nl) {
      // Get the depender.
      LinkEntry const& depender = this->EntryList[i];

      // Describe the depender.
      e << "  " << formatItem(depender) << "\n";

      // List its dependencies that are inside the component.
      EdgeList const& el = this->EntryConstraintGraph[i];
      for (cmGraphEdge const& ni : el) {
        size_t j = ni;
        if (cmap[j] == c) {
          LinkEntry const& dependee = this->EntryList[j];
          e << "    depends on " << formatItem(dependee) << "\n";
        }
      }
    }
    this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                      this->Target->GetBacktrace());

    return false;
  }

  return true;
}